

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register.cpp
# Opt level: O2

Base_game * cpp_client::Game_registry::get_game(string *name)

{
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>_>_>,_std::__detail::_Select1st,_cpp_client::Game_registry::Comper,_cpp_client::Game_registry::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  size_type sVar1;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>_>_>,_std::__detail::_Select1st,_cpp_client::Game_registry::Comper,_cpp_client::Game_registry::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  mapped_type *pmVar2;
  Game_not_found *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this = &name_map_abi_cxx11_()->_M_h;
  sVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>_>_>,_std::__detail::_Select1st,_cpp_client::Game_registry::Comper,_cpp_client::Game_registry::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::count(this,name);
  if (sVar1 != 0) {
    this_00 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>_>_>,_std::__detail::_Select1st,_cpp_client::Game_registry::Comper,_cpp_client::Game_registry::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)name_map_abi_cxx11_();
    pmVar2 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>_>_>,_std::__detail::_Select1st,_cpp_client::Game_registry::Comper,_cpp_client::Game_registry::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[](this_00,name);
    return (pmVar2->_M_t).
           super___uniq_ptr_impl<cpp_client::Base_game,_std::default_delete<cpp_client::Base_game>_>
           ._M_t.
           super__Tuple_impl<0UL,_cpp_client::Base_game_*,_std::default_delete<cpp_client::Base_game>_>
           .super__Head_base<0UL,_cpp_client::Base_game_*,_false>._M_head_impl;
  }
  this_01 = (Game_not_found *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_58,"The requested game \"",name);
  std::operator+(&local_38,&bStack_58,"\" was not found.");
  Game_not_found::range_error(this_01,&local_38);
  __cxa_throw(this_01,&Game_not_found::typeinfo,std::range_error::~range_error);
}

Assistant:

Base_game& Game_registry::get_game(const std::string& name)
{
   if(name_map().count(name))
   {
      return *name_map()[name];
   }
   else
   {
      throw Game_not_found("The requested game \"" + name + "\" was not found.");
   }
}